

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall DepthShader::fragment(DepthShader *this,Model *model,vec3f bar,TGAColor *color)

{
  double dVar1;
  size_t i;
  long lVar2;
  long lVar3;
  TGAColor res;
  undefined4 local_48 [2];
  byte local_40 [8];
  double local_38 [3];
  
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  lVar3 = 0;
  do {
    dVar1 = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_tri).rows[2].x + lVar3),&bar)
    ;
    lVar2 = 0;
    if (lVar3 != -0x30) {
      lVar2 = (ulong)(lVar3 != -0x18) * 8 + 8;
    }
    *(double *)((long)local_38 + lVar2) = dVar1;
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x48);
  local_40[0] = 0xff;
  local_40[1] = 0xff;
  local_40[2] = 0xff;
  local_40[3] = 0xff;
  local_48[0] = 0xffffffff;
  dVar1 = 1.0;
  if (local_38[2] / 500.0 <= 1.0) {
    dVar1 = local_38[2] / 500.0;
  }
  if (dVar1 <= 0.0) {
    dVar1 = 0.0;
  }
  lVar3 = 0;
  do {
    *(char *)((long)local_48 + lVar3) = (char)(int)((double)local_40[lVar3] * dVar1);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  color->bytespp = '\x04';
  *(undefined4 *)color->bgra = local_48[0];
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec3f p = varying_tri * bar;
        color = TGAColor(255, 255, 255) * (p.z / 500.f);
        return false;
    }